

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<int,libdivide::divider<int,(libdivide::Branching)0>>
                   (random_numerators<int> *vals,divider<int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  random_numerators<int> *this;
  random_numerators<int> *prVar4;
  int *in_RSI;
  random_numerators<int> *in_RDI;
  const_iterator iter;
  UIntT sum;
  int32_t q_1;
  int32_t sign_1;
  uint32_t uq_1;
  int32_t q;
  uint32_t uq;
  uint32_t mask;
  uint32_t sign;
  uint8_t shift;
  int64_t rl;
  int64_t yl;
  int64_t xl;
  random_numerators<int> *prVar5;
  uint local_94;
  int local_44;
  int local_24;
  
  local_94 = 0;
  this = (random_numerators<int> *)random_numerators<int>::begin(in_RDI);
  while( true ) {
    prVar5 = this;
    prVar4 = (random_numerators<int> *)random_numerators<int>::end(this);
    if (this == prVar4) break;
    uVar2 = *(uint *)&prVar5->_pData;
    bVar1 = *(byte *)(in_RSI + 1);
    bVar3 = bVar1 & 0x1f;
    if (*in_RSI == 0) {
      local_24 = ((int)(uVar2 + ((int)uVar2 >> 0x1f & (1 << bVar3) - 1U)) >> bVar3 ^
                 (int)(char)bVar1 >> 7) - ((int)(char)bVar1 >> 7);
    }
    else {
      local_44 = (int)((ulong)((long)(int)uVar2 * (long)*in_RSI) >> 0x20);
      if ((bVar1 & 0x40) != 0) {
        local_44 = ((uVar2 ^ (int)(char)bVar1 >> 7) - ((int)(char)bVar1 >> 7)) + local_44;
      }
      local_24 = (uint)(local_44 >> bVar3 < 0) + (local_44 >> bVar3);
    }
    local_94 = local_24 + local_94;
    this = (random_numerators<int> *)((long)&prVar5->_pData + 4);
  }
  return (ulong)local_94;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}